

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct64_stage11_sse4_1
               (__m128i *u,__m128i *out,int do_cols,int bd,int out_shift,__m128i *clamp_lo,
               __m128i *clamp_hi)

{
  int *piVar1;
  int *piVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int i;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  
  lVar9 = 0;
  for (lVar8 = 0x3f0; lVar8 != 0x1f0; lVar8 = lVar8 + -0x10) {
    piVar1 = (int *)((long)*u + lVar9);
    piVar2 = (int *)((long)*u + lVar8);
    iVar19 = *piVar2 + *piVar1;
    iVar21 = piVar2[1] + piVar1[1];
    iVar23 = piVar2[2] + piVar1[2];
    iVar25 = piVar2[3] + piVar1[3];
    iVar11 = *piVar1 - *piVar2;
    iVar13 = piVar1[1] - piVar2[1];
    iVar15 = piVar1[2] - piVar2[2];
    iVar17 = piVar1[3] - piVar2[3];
    iVar7 = (int)(*clamp_lo)[0];
    iVar4 = *(int *)((long)*clamp_lo + 4);
    iVar5 = (int)(*clamp_lo)[1];
    iVar6 = *(int *)((long)*clamp_lo + 0xc);
    uVar20 = (uint)(iVar19 < iVar7) * iVar7 | (uint)(iVar19 >= iVar7) * iVar19;
    uVar22 = (uint)(iVar21 < iVar4) * iVar4 | (uint)(iVar21 >= iVar4) * iVar21;
    uVar24 = (uint)(iVar23 < iVar5) * iVar5 | (uint)(iVar23 >= iVar5) * iVar23;
    uVar26 = (uint)(iVar25 < iVar6) * iVar6 | (uint)(iVar25 >= iVar6) * iVar25;
    iVar19 = (int)(*clamp_hi)[0];
    iVar21 = *(int *)((long)*clamp_hi + 4);
    iVar23 = (int)(*clamp_hi)[1];
    iVar25 = *(int *)((long)*clamp_hi + 0xc);
    uVar12 = (uint)(iVar11 < iVar7) * iVar7 | (uint)(iVar11 >= iVar7) * iVar11;
    uVar14 = (uint)(iVar13 < iVar4) * iVar4 | (uint)(iVar13 >= iVar4) * iVar13;
    uVar16 = (uint)(iVar15 < iVar5) * iVar5 | (uint)(iVar15 >= iVar5) * iVar15;
    uVar18 = (uint)(iVar17 < iVar6) * iVar6 | (uint)(iVar17 >= iVar6) * iVar17;
    puVar3 = (uint *)((long)*out + lVar9);
    *puVar3 = (uint)(iVar19 < (int)uVar20) * iVar19 | (iVar19 >= (int)uVar20) * uVar20;
    puVar3[1] = (uint)(iVar21 < (int)uVar22) * iVar21 | (iVar21 >= (int)uVar22) * uVar22;
    puVar3[2] = (uint)(iVar23 < (int)uVar24) * iVar23 | (iVar23 >= (int)uVar24) * uVar24;
    puVar3[3] = (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
    puVar3 = (uint *)((long)*out + lVar8);
    *puVar3 = (uint)(iVar19 < (int)uVar12) * iVar19 | (iVar19 >= (int)uVar12) * uVar12;
    puVar3[1] = (uint)(iVar21 < (int)uVar14) * iVar21 | (iVar21 >= (int)uVar14) * uVar14;
    puVar3[2] = (uint)(iVar23 < (int)uVar16) * iVar23 | (iVar23 >= (int)uVar16) * uVar16;
    puVar3[3] = (uint)(iVar25 < (int)uVar18) * iVar25 | (iVar25 >= (int)uVar18) * uVar18;
    lVar9 = lVar9 + 0x10;
  }
  if (do_cols == 0) {
    iVar7 = 10;
    if (10 < bd) {
      iVar7 = bd;
    }
    iVar7 = 0x20 << ((byte)iVar7 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar7;
    clamp_hi_out[0]._0_4_ = iVar7 + -1;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    for (uVar10 = 0; uVar10 < 0x40; uVar10 = uVar10 + 4) {
      round_shift_4x4(out,out_shift);
      highbd_clamp_epi32_sse4_1(out,out,&clamp_lo_out,&clamp_hi_out,4);
      out = out + 4;
    }
  }
  return;
}

Assistant:

static inline void idct64_stage11_sse4_1(__m128i *u, __m128i *out, int do_cols,
                                         int bd, int out_shift,
                                         const __m128i *clamp_lo,
                                         const __m128i *clamp_hi) {
  for (int i = 0; i < 32; i++) {
    addsub_sse4_1(u[i], u[63 - i], out + i, out + 63 - i, clamp_lo, clamp_hi);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    for (int i = 0; i < 64; i += 4) {
      round_shift_4x4(out + i, out_shift);
      highbd_clamp_epi32_sse4_1(out + i, out + i, &clamp_lo_out, &clamp_hi_out,
                                4);
    }
  }
}